

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void lua_close(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long in_RDI;
  int i;
  global_State *g;
  global_State *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar5;
  
  uVar2 = (ulong)*(uint *)(in_RDI + 8);
  uVar3 = (ulong)*(uint *)(uVar2 + 0x94);
  lj_func_closeuv(L,(TValue *)CONCAT44(g._4_4_,g._0_4_));
  lj_gc_separateudata((global_State *)L,g._4_4_);
  *(uint *)(uVar2 + 0x220) = *(uint *)(uVar2 + 0x220) & 0xfffffffe;
  *(undefined4 *)(uVar2 + 0x254) = 0;
  lj_dispatch_update(in_stack_00000030);
  iVar5 = 0;
  do {
    do {
      *(byte *)(uVar2 + 0x91) = *(byte *)(uVar2 + 0x91) | 0x10;
      *(undefined1 *)(uVar3 + 7) = 0;
      *(undefined8 *)(uVar3 + 0x30) = 0;
      lVar4 = (ulong)*(uint *)(uVar3 + 0x24) + 8;
      *(long *)(uVar3 + 0x18) = lVar4;
      *(long *)(uVar3 + 0x10) = lVar4;
      iVar1 = lj_vm_cpcall(uVar3,0,0,cpfinalize);
    } while (iVar1 != 0);
    iVar5 = iVar5 + 1;
  } while ((iVar5 < 10) &&
          (lj_gc_separateudata((global_State *)L,g._4_4_), *(int *)(uVar2 + 0x44) != 0));
  close_state((lua_State *)CONCAT44(iVar5,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

LUA_API void lua_close(lua_State *L)
{
  global_State *g = G(L);
  int i;
  L = mainthread(g);  /* Only the main thread can be closed. */
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_separateudata(g, 1);  /* Separate udata which have GC metamethods. */
#if LJ_HASJIT
  G2J(g)->flags &= ~JIT_F_ON;
  G2J(g)->state = LJ_TRACE_IDLE;
  lj_dispatch_update(g);
#endif
  for (i = 0;;) {
    hook_enter(g);
    L->status = 0;
    L->cframe = NULL;
    L->base = L->top = tvref(L->stack) + 1;
    if (lj_vm_cpcall(L, NULL, NULL, cpfinalize) == 0) {
      if (++i >= 10) break;
      lj_gc_separateudata(g, 1);  /* Separate udata again. */
      if (gcref(g->gc.mmudata) == NULL)  /* Until nothing is left to do. */
	break;
    }
  }
  close_state(L);
}